

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetLineControl::finishChange
          (QWidgetLineControl *this,int validateFromState,bool update,bool edited)

{
  undefined1 *puVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  ushort uVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  int cursorCopy;
  QString local_58;
  void *local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = *(ushort *)(this + 0x50);
  if ((uVar7 & 0x40) == 0) {
LAB_00423234:
    if ((char)uVar7 < '\0') {
      *(ushort *)(this + 0x50) = uVar7 & 0xff7f;
      QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
    }
    if (*(int *)(this + 0x40) == *(int *)(this + 100)) {
      QMetaObject::activate((QObject *)this,&staticMetaObject,6,(void **)0x0);
    }
    emitCursorPositionChanged(this);
  }
  else {
    *(ushort *)(this + 0x50) = uVar7 | 0x100;
    if ((*(long *)(this + 0xa8) == 0) ||
       (plVar6 = *(long **)(this + 0xb0),
       plVar6 == (long *)0x0 || *(int *)(*(long *)(this + 0xa8) + 4) == 0)) {
LAB_004230fc:
      if ((-1 < validateFromState && (uVar7 >> 8 & 1) != 0) && (((byte)this[0x51] & 1) == 0)) {
        if (*(long *)(this + 0x78) != 0) {
          bVar3 = false;
          goto LAB_00423283;
        }
        internalUndo(this,validateFromState);
        lVar5 = (long)*(int *)(this + 0xf4) * 0x10 + *(long *)(this + 0xf8);
        if (lVar5 != *(long *)(this + 0x100)) {
          *(long *)(this + 0x100) = lVar5;
        }
        if (*(int *)(this + 0xf4) < *(int *)(this + 0xf0)) {
          *(undefined4 *)(this + 0xf0) = 0xffffffff;
        }
        *(ushort *)(this + 0x50) = (ushort)*(undefined4 *)(this + 0x50) & 0xfebf | 0x100;
      }
      updateDisplayText(this,false);
      uVar7 = *(ushort *)(this + 0x50);
      if ((uVar7 & 0x40) != 0) {
        *(ushort *)(this + 0x50) = uVar7 & 0xffbf;
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        text(&local_58,this);
        if (edited) {
          local_38 = (void *)0x0;
          local_30 = (undefined1 *)&local_58;
          QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_38);
        }
        local_38 = (void *)0x0;
        local_30 = (undefined1 *)&local_58;
        QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_38);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        uVar7 = *(ushort *)(this + 0x50);
      }
      goto LAB_00423234;
    }
    local_58.d.d = *(Data **)(this + 0x18);
    local_58.d.ptr = *(char16_t **)(this + 0x20);
    local_58.d.size = *(qsizetype *)(this + 0x28);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      plVar6 = *(long **)(this + 0xb0);
    }
    local_38 = (void *)CONCAT44(local_38._4_4_,*(undefined4 *)(this + 0x40));
    iVar4 = (**(code **)(*plVar6 + 0x60))(plVar6,&local_58);
    *(ushort *)(this + 0x50) =
         (ushort)*(undefined4 *)(this + 0x50) & 0xfeff | (ushort)(iVar4 != 0) << 8;
    if (iVar4 == 0) {
      QMetaObject::activate((QObject *)this,&staticMetaObject,10,(void **)0x0);
LAB_004230db:
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_004230fc;
    }
    puVar1 = *(undefined1 **)(this + 0x28);
    if (puVar1 == (undefined1 *)local_58.d.size) {
      QVar8.m_data = *(storage_type_conflict **)(this + 0x20);
      QVar8.m_size = (qsizetype)puVar1;
      QVar9.m_data = local_58.d.ptr;
      QVar9.m_size = (qsizetype)puVar1;
      cVar2 = QtPrivate::equalStrings(QVar8,QVar9);
      if (cVar2 != '\0') {
        *(int *)(this + 0x40) = (int)local_38;
        goto LAB_004230db;
      }
    }
    internalSetText(this,&local_58,(int)local_38,edited);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar3 = true;
LAB_00423283:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetLineControl::finishChange(int validateFromState, bool update, bool edited)
{
    Q_UNUSED(update);

    if (m_textDirty) {
        // do validation
        bool wasValidInput = m_validInput;
        m_validInput = true;
#ifndef QT_NO_VALIDATOR
        if (m_validator) {
            QString textCopy = m_text;
            int cursorCopy = m_cursor;
            m_validInput = (m_validator->validate(textCopy, cursorCopy) != QValidator::Invalid);
            if (m_validInput) {
                if (m_text != textCopy) {
                    internalSetText(textCopy, cursorCopy, edited);
                    return true;
                }
                m_cursor = cursorCopy;
            } else {
                emit inputRejected();
            }
        }
#endif
        if (validateFromState >= 0 && wasValidInput && !m_validInput) {
            if (m_transactions.size())
                return false;
            internalUndo(validateFromState);
            m_history.erase(m_history.begin() + m_undoState, m_history.end());
            if (m_modifiedState > m_undoState)
                m_modifiedState = -1;
            m_validInput = true;
            m_textDirty = false;
        }
        updateDisplayText();

        if (m_textDirty) {
            m_textDirty = false;
            QString actualText = text();
            if (edited)
                emit textEdited(actualText);
            emit textChanged(actualText);
        }
    }
    if (m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    if (m_cursor == m_lastCursorPos)
        emit updateMicroFocus();
    emitCursorPositionChanged();
    return true;
}